

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *iEnd;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_longLengthType_e ZVar7;
  ZSTD_matchState_t *pZVar8;
  BYTE *pBVar9;
  ulong *mEnd;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  bool bVar13;
  undefined8 uVar14;
  char cVar15;
  long lVar16;
  ulong uVar17;
  size_t sVar18;
  BYTE *pBVar19;
  byte bVar20;
  byte bVar21;
  BYTE *iStart;
  ulong uVar22;
  ulong *puVar23;
  ulong *puVar24;
  BYTE *litEnd;
  ulong *puVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  ulong *puVar29;
  ulong uVar30;
  int *piVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  int iVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  seqDef *psVar45;
  U32 UVar46;
  ulong uVar47;
  ulong *puVar48;
  int iVar49;
  BYTE *pBVar50;
  ulong *puVar51;
  ulong *puVar52;
  BYTE *iend;
  U32 prefixStartIndex;
  U32 dictIndexDelta;
  BYTE *ilimit;
  BYTE *litLimit_w;
  BYTE *prefixStart;
  BYTE *dictBase;
  BYTE *litLimit_w_6;
  BYTE *litLimit_w_4;
  BYTE *dictEnd;
  BYTE *base;
  U32 *hashTable;
  char *_ptr;
  BYTE *dictStart;
  U32 dictStartIndex;
  uint local_130;
  
  pZVar8 = ms->dictMatchState;
  if (pZVar8 == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x29c,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar43 = (ms->cParams).targetLength;
  uVar47 = (ulong)(uVar43 + (uVar43 == 0));
  pBVar9 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar9 + uVar4;
  iEnd = (ulong *)((long)src + srcSize);
  puVar29 = (ulong *)((long)src + (srcSize - 8));
  uVar5 = (pZVar8->window).dictLimit;
  mEnd = (ulong *)(pZVar8->window).nextSrc;
  pBVar10 = (pZVar8->window).base;
  pBVar50 = pBVar10 + uVar5;
  uVar33 = (int)mEnd - (int)pBVar10;
  uVar26 = uVar4 - uVar33;
  iVar27 = ((int)src - (int)iStart) + (int)mEnd;
  iVar49 = (int)pBVar50;
  uVar28 = iVar27 - iVar49;
  uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  pUVar11 = pZVar8->hashTable;
  uVar42 = (pZVar8->cParams).hashLog;
  iVar41 = (int)pBVar9;
  uVar36 = ((int)iEnd - iVar41) - uVar4;
  uVar39 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  uVar6 = (ms->cParams).hashLog;
  uVar37 = *rep;
  local_130 = rep[1];
  uVar43 = uVar42 + 8;
  bVar20 = (byte)uVar42;
  cVar15 = (char)uVar6;
  puVar52 = (ulong *)src;
  if (uVar39 == 5) {
    if (uVar35 < uVar36) goto LAB_007ee47e;
    if (uVar4 < uVar33) goto LAB_007ee49d;
    if ((ms->prefetchCDictTables != 0) && (uVar42 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar20 & 0x3f)));
    }
    if (uVar28 < uVar37) goto LAB_007ee4bc;
    if (uVar28 < local_130) goto LAB_007ee4db;
    puVar48 = (ulong *)((long)src + uVar47);
    if (puVar48 <= puVar29) {
      if ((uVar6 < 0x21) && (uVar43 < 0x21)) {
        bVar21 = 0x40 - cVar15;
        puVar1 = iEnd + -4;
        puVar25 = (ulong *)((long)src + (ulong)(iVar27 == iVar49));
LAB_007ecebf:
        uVar22 = *puVar25 * -0x30e4432345000000;
        uVar40 = uVar22 >> (0x38 - bVar20 & 0x3f);
        uVar44 = (ulong)pUVar11[uVar40 >> 8];
        uVar40 = uVar40 ^ uVar44;
        puVar23 = puVar25 + 0x20;
        uVar34 = uVar47;
LAB_007ecefc:
        puVar24 = puVar48;
        uVar30 = uVar22 >> (bVar21 & 0x3f);
        uVar43 = pUVar12[uVar30];
        uVar17 = (ulong)uVar43;
        UVar46 = (U32)((long)puVar25 - (long)pBVar9);
        uVar42 = (UVar46 - uVar37) + 1;
        uVar22 = *puVar24 * -0x30e4432345000000;
        uVar38 = uVar22 >> (0x38 - bVar20 & 0x3f);
        pUVar12[uVar30] = UVar46;
        if ((uVar4 - 1) - uVar42 < 3) {
LAB_007ecf7e:
          puVar48 = puVar25;
          if ((char)uVar40 == '\0') {
            uVar40 = uVar44 >> 8;
            uVar42 = (uint)(uVar44 >> 8);
            if (((uVar5 < uVar42) && (*(int *)(pBVar10 + uVar40) == (int)*puVar25)) &&
               (uVar43 <= uVar4)) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar25 + 4),pBVar10 + uVar40 + 4,(BYTE *)iEnd,
                                  (BYTE *)mEnd,iStart);
              uVar34 = sVar18 + 4;
              if (puVar25 <= puVar52) goto LAB_007ed4e6;
              pBVar19 = pBVar10 + (uVar40 - 1);
              goto LAB_007ed22a;
            }
          }
          if ((uVar4 < uVar43) && (piVar31 = (int *)(pBVar9 + uVar17), *piVar31 == (int)*puVar25))
          goto LAB_007ed0e5;
          uVar34 = (uVar34 + 1) - (ulong)(puVar24 < puVar23);
          if (puVar29 < (ulong *)((long)puVar24 + uVar34)) goto LAB_007ee381;
          puVar23 = puVar23 + (ulong)(puVar23 <= puVar24) * 0x20;
          uVar44 = (ulong)pUVar11[uVar38 >> 8];
          uVar40 = uVar38 ^ uVar44;
          puVar48 = (ulong *)((long)puVar24 + uVar34);
          puVar25 = puVar24;
          goto LAB_007ecefc;
        }
        piVar31 = (int *)(pBVar9 + uVar42);
        if (uVar42 < uVar4) {
          piVar31 = (int *)(pBVar10 + (uVar42 - uVar26));
        }
        if (*piVar31 != *(int *)((long)puVar25 + 1)) goto LAB_007ecf7e;
        puVar48 = iEnd;
        if (uVar42 < uVar4) {
          puVar48 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar48,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_007ee3a5;
        if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
        puVar48 = (ulong *)((long)puVar25 + 1);
        uVar22 = (long)puVar48 - (long)puVar52;
        puVar23 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22))
        goto LAB_007ee421;
        if (iEnd < puVar48) goto LAB_007ee402;
        if (puVar1 < puVar48) {
          ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
          goto LAB_007ed0ad;
        }
        uVar34 = puVar52[1];
        *puVar23 = *puVar52;
        puVar23[1] = uVar34;
        pBVar19 = seqStore->lit;
        if (uVar22 < 0x11) {
          seqStore->lit = pBVar19 + uVar22;
          goto LAB_007ed25e;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
        goto LAB_007ee576;
        uVar34 = puVar52[3];
        *(ulong *)(pBVar19 + 0x10) = puVar52[2];
        *(ulong *)(pBVar19 + 0x18) = uVar34;
        if (0x20 < (long)uVar22) {
          lVar32 = 0;
          do {
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
            uVar14 = puVar3[1];
            pBVar2 = pBVar19 + lVar32 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar14;
            lVar32 = lVar32 + 0x20;
          } while (pBVar2 + 0x20 < pBVar19 + uVar22);
        }
LAB_007ed0ad:
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_007ed25e:
        uVar34 = sVar18 + 4;
        psVar45 = seqStore->sequences;
        psVar45->litLength = (U16)uVar22;
        psVar45->offBase = 1;
        if (2 < uVar34) {
          uVar22 = sVar18 + 1;
          uVar43 = uVar37;
          if (uVar22 < 0x10000) goto LAB_007ed675;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_007ed65c;
          goto LAB_007ee440;
        }
        goto LAB_007ee3e3;
      }
      goto LAB_007ee4fa;
    }
  }
  else if (uVar39 == 6) {
    if (uVar35 < uVar36) goto LAB_007ee47e;
    if (uVar4 < uVar33) goto LAB_007ee49d;
    if ((ms->prefetchCDictTables != 0) && (uVar42 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar20 & 0x3f)));
    }
    if (uVar28 < uVar37) goto LAB_007ee4bc;
    if (uVar28 < local_130) goto LAB_007ee4db;
    puVar48 = (ulong *)((long)src + uVar47);
    if (puVar48 <= puVar29) {
      if ((uVar6 < 0x21) && (uVar43 < 0x21)) {
        bVar21 = 0x40 - cVar15;
        puVar1 = iEnd + -4;
        puVar25 = (ulong *)((long)src + (ulong)(iVar27 == iVar49));
LAB_007ec3b8:
        uVar22 = *puVar25 * -0x30e4432340650000;
        uVar40 = uVar22 >> (0x38 - bVar20 & 0x3f);
        uVar44 = (ulong)pUVar11[uVar40 >> 8];
        uVar40 = uVar40 ^ uVar44;
        puVar23 = puVar25 + 0x20;
        uVar34 = uVar47;
LAB_007ec3f5:
        puVar24 = puVar48;
        uVar30 = uVar22 >> (bVar21 & 0x3f);
        uVar43 = pUVar12[uVar30];
        uVar17 = (ulong)uVar43;
        UVar46 = (U32)((long)puVar25 - (long)pBVar9);
        uVar42 = (UVar46 - uVar37) + 1;
        uVar22 = *puVar24 * -0x30e4432340650000;
        uVar38 = uVar22 >> (0x38 - bVar20 & 0x3f);
        pUVar12[uVar30] = UVar46;
        if ((uVar4 - 1) - uVar42 < 3) {
LAB_007ec472:
          puVar48 = puVar25;
          if ((char)uVar40 == '\0') {
            uVar40 = uVar44 >> 8;
            uVar42 = (uint)(uVar44 >> 8);
            if (((uVar5 < uVar42) && (*(int *)(pBVar10 + uVar40) == (int)*puVar25)) &&
               (uVar43 <= uVar4)) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar25 + 4),pBVar10 + uVar40 + 4,(BYTE *)iEnd,
                                  (BYTE *)mEnd,iStart);
              uVar34 = sVar18 + 4;
              if (puVar25 <= puVar52) goto LAB_007ec9d4;
              pBVar19 = pBVar10 + (uVar40 - 1);
              goto LAB_007ec71b;
            }
          }
          if ((uVar4 < uVar43) && (piVar31 = (int *)(pBVar9 + uVar17), *piVar31 == (int)*puVar25))
          goto LAB_007ec5d6;
          uVar34 = (uVar34 + 1) - (ulong)(puVar24 < puVar23);
          if (puVar29 < (ulong *)((long)puVar24 + uVar34)) goto LAB_007ee381;
          puVar23 = puVar23 + (ulong)(puVar23 <= puVar24) * 0x20;
          uVar44 = (ulong)pUVar11[uVar38 >> 8];
          uVar40 = uVar38 ^ uVar44;
          puVar48 = (ulong *)((long)puVar24 + uVar34);
          puVar25 = puVar24;
          goto LAB_007ec3f5;
        }
        piVar31 = (int *)(pBVar9 + uVar42);
        if (uVar42 < uVar4) {
          piVar31 = (int *)(pBVar10 + (uVar42 - uVar26));
        }
        if (*piVar31 != *(int *)((long)puVar25 + 1)) goto LAB_007ec472;
        puVar48 = iEnd;
        if (uVar42 < uVar4) {
          puVar48 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar48,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_007ee3a5;
        if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
        puVar48 = (ulong *)((long)puVar25 + 1);
        uVar22 = (long)puVar48 - (long)puVar52;
        puVar23 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22))
        goto LAB_007ee421;
        if (iEnd < puVar48) goto LAB_007ee402;
        if (puVar1 < puVar48) {
          ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
          goto LAB_007ec59e;
        }
        uVar34 = puVar52[1];
        *puVar23 = *puVar52;
        puVar23[1] = uVar34;
        pBVar19 = seqStore->lit;
        if (uVar22 < 0x11) {
          seqStore->lit = pBVar19 + uVar22;
          goto LAB_007ec74f;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
        goto LAB_007ee576;
        uVar34 = puVar52[3];
        *(ulong *)(pBVar19 + 0x10) = puVar52[2];
        *(ulong *)(pBVar19 + 0x18) = uVar34;
        if (0x20 < (long)uVar22) {
          lVar32 = 0;
          do {
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
            uVar14 = puVar3[1];
            pBVar2 = pBVar19 + lVar32 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar14;
            lVar32 = lVar32 + 0x20;
          } while (pBVar2 + 0x20 < pBVar19 + uVar22);
        }
LAB_007ec59e:
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_007ec74f:
        uVar34 = sVar18 + 4;
        psVar45 = seqStore->sequences;
        psVar45->litLength = (U16)uVar22;
        psVar45->offBase = 1;
        if (2 < uVar34) {
          uVar22 = sVar18 + 1;
          uVar43 = uVar37;
          if (uVar22 < 0x10000) goto LAB_007ecb63;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_007ecb4a;
          goto LAB_007ee440;
        }
        goto LAB_007ee3e3;
      }
      goto LAB_007ee4fa;
    }
  }
  else if (uVar39 == 7) {
    if (uVar35 < uVar36) {
LAB_007ee47e:
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x1ee,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (uVar4 < uVar33) {
LAB_007ee49d:
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x1f5,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if ((ms->prefetchCDictTables != 0) && (uVar42 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar20 & 0x3f)));
    }
    if (uVar28 < uVar37) {
LAB_007ee4bc:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x201,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (uVar28 < local_130) {
LAB_007ee4db:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x202,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    puVar48 = (ulong *)((long)src + uVar47);
    if (puVar48 <= puVar29) {
      if ((uVar6 < 0x21) && (uVar43 < 0x21)) {
        bVar21 = 0x40 - cVar15;
        puVar1 = iEnd + -4;
        puVar25 = (ulong *)((long)src + (ulong)(iVar27 == iVar49));
LAB_007eb8a5:
        uVar22 = *puVar25 * -0x30e44323405a9d00;
        uVar40 = uVar22 >> (0x38 - bVar20 & 0x3f);
        uVar44 = (ulong)pUVar11[uVar40 >> 8];
        uVar40 = uVar40 ^ uVar44;
        puVar23 = puVar25 + 0x20;
        uVar34 = uVar47;
LAB_007eb8e2:
        puVar24 = puVar48;
        uVar30 = uVar22 >> (bVar21 & 0x3f);
        uVar43 = pUVar12[uVar30];
        uVar17 = (ulong)uVar43;
        UVar46 = (U32)((long)puVar25 - (long)pBVar9);
        uVar42 = (UVar46 - uVar37) + 1;
        uVar22 = *puVar24 * -0x30e44323405a9d00;
        uVar38 = uVar22 >> (0x38 - bVar20 & 0x3f);
        pUVar12[uVar30] = UVar46;
        if ((uVar4 - 1) - uVar42 < 3) {
LAB_007eb95f:
          puVar48 = puVar25;
          if ((char)uVar40 == '\0') {
            uVar40 = uVar44 >> 8;
            uVar42 = (uint)(uVar44 >> 8);
            if (((uVar5 < uVar42) && (*(int *)(pBVar10 + uVar40) == (int)*puVar25)) &&
               (uVar43 <= uVar4)) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar25 + 4),pBVar10 + uVar40 + 4,(BYTE *)iEnd,
                                  (BYTE *)mEnd,iStart);
              uVar34 = sVar18 + 4;
              if (puVar25 <= puVar52) goto LAB_007ebec1;
              pBVar19 = pBVar10 + (uVar40 - 1);
              goto LAB_007ebc08;
            }
          }
          if ((uVar4 < uVar43) && (piVar31 = (int *)(pBVar9 + uVar17), *piVar31 == (int)*puVar25))
          goto LAB_007ebac3;
          uVar34 = (uVar34 + 1) - (ulong)(puVar24 < puVar23);
          if (puVar29 < (ulong *)((long)puVar24 + uVar34)) goto LAB_007ee381;
          puVar23 = puVar23 + (ulong)(puVar23 <= puVar24) * 0x20;
          uVar44 = (ulong)pUVar11[uVar38 >> 8];
          uVar40 = uVar38 ^ uVar44;
          puVar48 = (ulong *)((long)puVar24 + uVar34);
          puVar25 = puVar24;
          goto LAB_007eb8e2;
        }
        piVar31 = (int *)(pBVar9 + uVar42);
        if (uVar42 < uVar4) {
          piVar31 = (int *)(pBVar10 + (uVar42 - uVar26));
        }
        if (*piVar31 != *(int *)((long)puVar25 + 1)) goto LAB_007eb95f;
        puVar48 = iEnd;
        if (uVar42 < uVar4) {
          puVar48 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar48,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_007ee3a5;
        if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
        puVar48 = (ulong *)((long)puVar25 + 1);
        uVar22 = (long)puVar48 - (long)puVar52;
        puVar23 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22))
        goto LAB_007ee421;
        if (iEnd < puVar48) goto LAB_007ee402;
        if (puVar1 < puVar48) {
          ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
          goto LAB_007eba8b;
        }
        uVar34 = puVar52[1];
        *puVar23 = *puVar52;
        puVar23[1] = uVar34;
        pBVar19 = seqStore->lit;
        if (uVar22 < 0x11) {
          seqStore->lit = pBVar19 + uVar22;
          goto LAB_007ebc3c;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
        goto LAB_007ee576;
        uVar34 = puVar52[3];
        *(ulong *)(pBVar19 + 0x10) = puVar52[2];
        *(ulong *)(pBVar19 + 0x18) = uVar34;
        if (0x20 < (long)uVar22) {
          lVar32 = 0;
          do {
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
            uVar14 = puVar3[1];
            pBVar2 = pBVar19 + lVar32 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar14;
            lVar32 = lVar32 + 0x20;
          } while (pBVar2 + 0x20 < pBVar19 + uVar22);
        }
LAB_007eba8b:
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_007ee557:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_007ebc3c:
        uVar34 = sVar18 + 4;
        psVar45 = seqStore->sequences;
        psVar45->litLength = (U16)uVar22;
        psVar45->offBase = 1;
        if (uVar34 < 3) {
LAB_007ee3e3:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar22 = sVar18 + 1;
        uVar43 = uVar37;
        if (uVar22 < 0x10000) goto LAB_007ec050;
        if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_007ec037;
LAB_007ee440:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
LAB_007ee4fa:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
  }
  else {
    if (uVar35 < uVar36) goto LAB_007ee47e;
    if (uVar4 < uVar33) goto LAB_007ee49d;
    if ((ms->prefetchCDictTables != 0) && (uVar42 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar20 & 0x3f)));
    }
    if (uVar28 < uVar37) goto LAB_007ee4bc;
    if (uVar28 < local_130) goto LAB_007ee4db;
    puVar48 = (ulong *)((long)src + uVar47);
    if (puVar48 <= puVar29) {
      if ((uVar6 < 0x21) && (uVar43 < 0x21)) {
        bVar21 = 0x20 - cVar15;
        puVar1 = iEnd + -4;
        puVar25 = (ulong *)((long)src + (ulong)(iVar27 == iVar49));
LAB_007ed9e5:
        uVar42 = (int)*puVar25 * -0x61c8864f;
        uVar39 = uVar42 >> (0x18 - bVar20 & 0x1f);
        uVar43 = pUVar11[uVar39 >> 8];
        uVar39 = uVar39 ^ uVar43;
        puVar23 = puVar25 + 0x20;
        uVar34 = uVar47;
LAB_007eda20:
        uVar28 = uVar42 >> (bVar21 & 0x1f);
        uVar6 = pUVar12[uVar28];
        uVar22 = (ulong)uVar6;
        UVar46 = (U32)((long)puVar25 - (long)pBVar9);
        uVar35 = (UVar46 - uVar37) + 1;
        uVar42 = (int)*puVar48 * -0x61c8864f;
        uVar33 = uVar42 >> (0x18 - bVar20 & 0x1f);
        pUVar12[uVar28] = UVar46;
        if ((uVar4 - 1) - uVar35 < 3) {
LAB_007eda92:
          puVar24 = puVar25;
          if ((char)uVar39 == '\0') {
            uVar43 = uVar43 >> 8;
            if (((uVar5 < uVar43) && (*(int *)(pBVar10 + uVar43) == (int)*puVar25)) &&
               (uVar6 <= uVar4)) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar25 + 4),pBVar10 + (ulong)uVar43 + 4,
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              uVar34 = sVar18 + 4;
              if (puVar25 <= puVar52) goto LAB_007edfe8;
              pBVar19 = pBVar10 + ((ulong)uVar43 - 1);
              goto LAB_007edd37;
            }
          }
          if ((uVar4 < uVar6) && (piVar31 = (int *)(pBVar9 + uVar22), *piVar31 == (int)*puVar25))
          goto LAB_007edbf5;
          uVar34 = (uVar34 + 1) - (ulong)(puVar48 < puVar23);
          if (puVar29 < (ulong *)((long)puVar48 + uVar34)) goto LAB_007ee381;
          puVar23 = puVar23 + (ulong)(puVar23 <= puVar48) * 0x20;
          uVar43 = pUVar11[uVar33 >> 8];
          uVar39 = uVar33 ^ uVar43;
          puVar25 = puVar48;
          puVar48 = (ulong *)((long)puVar48 + uVar34);
          goto LAB_007eda20;
        }
        piVar31 = (int *)(pBVar9 + uVar35);
        if (uVar35 < uVar4) {
          piVar31 = (int *)(pBVar10 + (uVar35 - uVar26));
        }
        if (*piVar31 != *(int *)((long)puVar25 + 1)) goto LAB_007eda92;
        puVar48 = iEnd;
        if (uVar35 < uVar4) {
          puVar48 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar48,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_007ee3a5;
        if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
        puVar24 = (ulong *)((long)puVar25 + 1);
        uVar22 = (long)puVar24 - (long)puVar52;
        puVar48 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar48 + uVar22))
        goto LAB_007ee421;
        if (iEnd < puVar24) goto LAB_007ee402;
        if (puVar1 < puVar24) {
          ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar24,(BYTE *)puVar1);
          goto LAB_007edbbd;
        }
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
        pBVar19 = seqStore->lit;
        if (uVar22 < 0x11) {
          seqStore->lit = pBVar19 + uVar22;
          goto LAB_007edd6b;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
        goto LAB_007ee576;
        uVar34 = puVar52[3];
        *(ulong *)(pBVar19 + 0x10) = puVar52[2];
        *(ulong *)(pBVar19 + 0x18) = uVar34;
        if (0x20 < (long)uVar22) {
          lVar32 = 0;
          do {
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
            uVar14 = puVar3[1];
            pBVar2 = pBVar19 + lVar32 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar14;
            lVar32 = lVar32 + 0x20;
          } while (pBVar2 + 0x20 < pBVar19 + uVar22);
        }
LAB_007edbbd:
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_007edd6b:
        uVar34 = sVar18 + 4;
        psVar45 = seqStore->sequences;
        psVar45->litLength = (U16)uVar22;
        psVar45->offBase = 1;
        if (2 < uVar34) {
          uVar22 = sVar18 + 1;
          uVar43 = uVar37;
          if (uVar22 < 0x10000) goto LAB_007ee161;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_007ee148;
          goto LAB_007ee440;
        }
        goto LAB_007ee3e3;
      }
      goto LAB_007ee4fa;
    }
  }
LAB_007ee381:
  *rep = uVar37;
  rep[1] = local_130;
  return (long)iEnd - (long)puVar52;
  while (bVar13 = pBVar50 < pBVar19, pBVar19 = pBVar19 + -1, bVar13) {
LAB_007ed22a:
    puVar23 = (ulong *)((long)puVar48 + -1);
    if ((*(BYTE *)puVar23 != *pBVar19) ||
       (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
  }
LAB_007ed4e6:
  uVar43 = UVar46 - (uVar42 + uVar26);
  if (uVar43 == 0) goto LAB_007ee595;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_007ee3a5;
  if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_007ee421;
  if (iEnd < puVar48) goto LAB_007ee402;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_007ed565:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_007ee576;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_007ed565;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_007ee3e3;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_007ed675;
  ZVar7 = seqStore->longLengthType;
  goto joined_r0x007ed656;
LAB_007ed0e5:
  puVar23 = (ulong *)((long)puVar25 + 4);
  puVar24 = (ulong *)(piVar31 + 1);
  puVar51 = puVar23;
  if (puVar23 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar24 == *puVar23) {
      lVar32 = 0;
      do {
        puVar24 = (ulong *)((long)puVar25 + lVar32 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar24) {
          puVar24 = (ulong *)(pBVar9 + lVar32 + uVar17 + 0xc);
          puVar51 = (ulong *)((long)puVar25 + lVar32 + 0xc);
          goto LAB_007ed2c9;
        }
        lVar16 = lVar32 + uVar17 + 0xc;
        uVar34 = *puVar24;
        lVar32 = lVar32 + 8;
      } while (*(ulong *)(pBVar9 + lVar16) == uVar34);
      uVar34 = uVar34 ^ *(ulong *)(pBVar9 + lVar16);
      uVar22 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar34 = (uVar22 >> 3 & 0x1fffffff) + lVar32;
    }
    else {
      uVar22 = *puVar23 ^ *puVar24;
      uVar34 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar34 = uVar34 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_007ed2c9:
    if ((puVar51 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 4);
      puVar24 = (ulong *)((long)puVar24 + 4);
    }
    if ((puVar51 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 2);
      puVar24 = (ulong *)((long)puVar24 + 2);
    }
    if (puVar51 < iEnd) {
      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar51));
    }
    uVar34 = (long)puVar51 - (long)puVar23;
  }
  uVar34 = uVar34 + 4;
  if (puVar52 < puVar25) {
    pBVar19 = pBVar9 + (uVar17 - 1);
    do {
      puVar23 = (ulong *)((long)puVar48 + -1);
      if ((*(BYTE *)puVar23 != *pBVar19) ||
         (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
      bVar13 = iStart < pBVar19;
      pBVar19 = pBVar19 + -1;
    } while (bVar13);
  }
  uVar43 = (int)puVar25 - (int)piVar31;
  if (uVar43 == 0) goto LAB_007ee538;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_007ee3a5;
  if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_007ee421;
  if (iEnd < puVar48) goto LAB_007ee402;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_007ed3e5:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_007ee576;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_007ed3e5;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_007ee3e3;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_007ed675;
  ZVar7 = seqStore->longLengthType;
joined_r0x007ed656:
  local_130 = uVar37;
  if (ZVar7 != ZSTD_llt_none) goto LAB_007ee440;
LAB_007ed65c:
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
LAB_007ed675:
  uVar37 = uVar43;
  puVar52 = (ulong *)(uVar34 + (long)puVar48);
  psVar45->mlBase = (U16)uVar22;
  psVar45 = psVar45 + 1;
  seqStore->sequences = psVar45;
  if (puVar52 <= puVar29) {
    if (pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_007ee519;
    pUVar12[(ulong)(*(long *)(pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2) *
                   -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar46 + 2;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e4432345000000) >> (bVar21 & 0x3f)] =
         ((int)puVar52 + -2) - iVar41;
    do {
      uVar42 = uVar37;
      UVar46 = (int)puVar52 - iVar41;
      uVar43 = UVar46 - local_130;
      pBVar19 = pBVar9;
      if (uVar43 < uVar4) {
        pBVar19 = pBVar10 + -(ulong)uVar26;
      }
      uVar37 = uVar42;
      if (((uVar4 - 1) - uVar43 < 3) || (*(int *)(pBVar19 + uVar43) != (int)*puVar52)) break;
      puVar48 = iEnd;
      if (uVar43 < uVar4) {
        puVar48 = mEnd;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar19 + uVar43) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar48,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar45 - (long)seqStore->sequencesStart >> 3))
      goto LAB_007ee3a5;
      if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
      puVar48 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar48) goto LAB_007ee421;
      if (iEnd < puVar52) goto LAB_007ee402;
      if (puVar1 < puVar52) {
        ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar1);
      }
      else {
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
      }
      psVar45 = seqStore->sequences;
      psVar45->litLength = 0;
      psVar45->offBase = 1;
      if (sVar18 + 4 < 3) goto LAB_007ee3e3;
      if (0xffff < sVar18 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee440;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar45->mlBase = (U16)(sVar18 + 1);
      psVar45 = psVar45 + 1;
      seqStore->sequences = psVar45;
      pUVar12[*puVar52 * -0x30e4432345000000 >> (bVar21 & 0x3f)] = UVar46;
      puVar52 = (ulong *)((long)puVar52 + sVar18 + 4);
      uVar37 = local_130;
      local_130 = uVar42;
    } while (puVar52 <= puVar29);
  }
  puVar48 = (ulong *)((long)puVar52 + uVar47);
  puVar25 = puVar52;
  if (puVar29 < puVar48) goto LAB_007ee381;
  goto LAB_007ecebf;
  while (bVar13 = pBVar50 < pBVar19, pBVar19 = pBVar19 + -1, bVar13) {
LAB_007ec71b:
    puVar23 = (ulong *)((long)puVar48 + -1);
    if ((*(BYTE *)puVar23 != *pBVar19) ||
       (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
  }
LAB_007ec9d4:
  uVar43 = UVar46 - (uVar42 + uVar26);
  if (uVar43 == 0) goto LAB_007ee595;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_007ee3a5;
  if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_007ee421;
  if (iEnd < puVar48) goto LAB_007ee402;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_007eca53:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_007ee576;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_007eca53;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_007ee3e3;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_007ecb63;
  ZVar7 = seqStore->longLengthType;
  goto joined_r0x007ecb44;
LAB_007ec5d6:
  puVar23 = (ulong *)((long)puVar25 + 4);
  puVar24 = (ulong *)(piVar31 + 1);
  puVar51 = puVar23;
  if (puVar23 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar24 == *puVar23) {
      lVar32 = 0;
      do {
        puVar24 = (ulong *)((long)puVar25 + lVar32 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar24) {
          puVar24 = (ulong *)(pBVar9 + lVar32 + uVar17 + 0xc);
          puVar51 = (ulong *)((long)puVar25 + lVar32 + 0xc);
          goto LAB_007ec7ba;
        }
        lVar16 = lVar32 + uVar17 + 0xc;
        uVar34 = *puVar24;
        lVar32 = lVar32 + 8;
      } while (*(ulong *)(pBVar9 + lVar16) == uVar34);
      uVar34 = uVar34 ^ *(ulong *)(pBVar9 + lVar16);
      uVar22 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar34 = (uVar22 >> 3 & 0x1fffffff) + lVar32;
    }
    else {
      uVar22 = *puVar23 ^ *puVar24;
      uVar34 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar34 = uVar34 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_007ec7ba:
    if ((puVar51 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 4);
      puVar24 = (ulong *)((long)puVar24 + 4);
    }
    if ((puVar51 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 2);
      puVar24 = (ulong *)((long)puVar24 + 2);
    }
    if (puVar51 < iEnd) {
      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar51));
    }
    uVar34 = (long)puVar51 - (long)puVar23;
  }
  uVar34 = uVar34 + 4;
  if (puVar52 < puVar25) {
    pBVar19 = pBVar9 + (uVar17 - 1);
    do {
      puVar23 = (ulong *)((long)puVar48 + -1);
      if ((*(BYTE *)puVar23 != *pBVar19) ||
         (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
      bVar13 = iStart < pBVar19;
      pBVar19 = pBVar19 + -1;
    } while (bVar13);
  }
  uVar43 = (int)puVar25 - (int)piVar31;
  if (uVar43 == 0) goto LAB_007ee538;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_007ee3a5;
  if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_007ee421;
  if (iEnd < puVar48) goto LAB_007ee402;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_007ec8d3:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_007ee576;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_007ec8d3;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_007ee3e3;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_007ecb63;
  ZVar7 = seqStore->longLengthType;
joined_r0x007ecb44:
  local_130 = uVar37;
  if (ZVar7 != ZSTD_llt_none) goto LAB_007ee440;
LAB_007ecb4a:
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
LAB_007ecb63:
  uVar37 = uVar43;
  puVar52 = (ulong *)(uVar34 + (long)puVar48);
  psVar45->mlBase = (U16)uVar22;
  psVar45 = psVar45 + 1;
  seqStore->sequences = psVar45;
  if (puVar52 <= puVar29) {
    if (pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_007ee519;
    pUVar12[(ulong)(*(long *)(pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2) *
                   -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar46 + 2;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e4432340650000) >> (bVar21 & 0x3f)] =
         ((int)puVar52 + -2) - iVar41;
    do {
      uVar42 = uVar37;
      UVar46 = (int)puVar52 - iVar41;
      uVar43 = UVar46 - local_130;
      pBVar19 = pBVar9;
      if (uVar43 < uVar4) {
        pBVar19 = pBVar10 + -(ulong)uVar26;
      }
      uVar37 = uVar42;
      if (((uVar4 - 1) - uVar43 < 3) || (*(int *)(pBVar19 + uVar43) != (int)*puVar52)) break;
      puVar48 = iEnd;
      if (uVar43 < uVar4) {
        puVar48 = mEnd;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar19 + uVar43) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar48,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar45 - (long)seqStore->sequencesStart >> 3))
      goto LAB_007ee3a5;
      if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
      puVar48 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar48) goto LAB_007ee421;
      if (iEnd < puVar52) goto LAB_007ee402;
      if (puVar1 < puVar52) {
        ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar1);
      }
      else {
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
      }
      psVar45 = seqStore->sequences;
      psVar45->litLength = 0;
      psVar45->offBase = 1;
      if (sVar18 + 4 < 3) goto LAB_007ee3e3;
      if (0xffff < sVar18 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee440;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar45->mlBase = (U16)(sVar18 + 1);
      psVar45 = psVar45 + 1;
      seqStore->sequences = psVar45;
      pUVar12[*puVar52 * -0x30e4432340650000 >> (bVar21 & 0x3f)] = UVar46;
      puVar52 = (ulong *)((long)puVar52 + sVar18 + 4);
      uVar37 = local_130;
      local_130 = uVar42;
    } while (puVar52 <= puVar29);
  }
  puVar48 = (ulong *)((long)puVar52 + uVar47);
  puVar25 = puVar52;
  if (puVar29 < puVar48) goto LAB_007ee381;
  goto LAB_007ec3b8;
  while (bVar13 = pBVar50 < pBVar19, pBVar19 = pBVar19 + -1, bVar13) {
LAB_007edd37:
    puVar48 = (ulong *)((long)puVar24 + -1);
    if ((*(BYTE *)puVar48 != *pBVar19) ||
       (uVar34 = uVar34 + 1, puVar24 = puVar48, puVar48 <= puVar52)) break;
  }
LAB_007edfe8:
  uVar43 = UVar46 - (uVar43 + uVar26);
  if (uVar43 == 0) goto LAB_007ee595;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_007ee3a5;
  if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
  uVar22 = (long)puVar24 - (long)puVar52;
  puVar48 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar48 + uVar22)) goto LAB_007ee421;
  if (iEnd < puVar24) goto LAB_007ee402;
  if (puVar1 < puVar24) {
    ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar24,(BYTE *)puVar1);
LAB_007ee05e:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar48 = *puVar52;
    puVar48[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_007ee576;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_007ee05e;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_007ee3e3;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_007ee161;
  ZVar7 = seqStore->longLengthType;
  goto joined_r0x007ee142;
LAB_007edbf5:
  puVar48 = (ulong *)((long)puVar25 + 4);
  puVar23 = (ulong *)(piVar31 + 1);
  puVar51 = puVar48;
  if (puVar48 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar23 == *puVar48) {
      lVar32 = 0;
      do {
        puVar23 = (ulong *)((long)puVar25 + lVar32 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar23) {
          puVar23 = (ulong *)(pBVar9 + lVar32 + uVar22 + 0xc);
          puVar51 = (ulong *)((long)puVar25 + lVar32 + 0xc);
          goto LAB_007eddd5;
        }
        lVar16 = lVar32 + uVar22 + 0xc;
        uVar34 = *puVar23;
        lVar32 = lVar32 + 8;
      } while (*(ulong *)(pBVar9 + lVar16) == uVar34);
      uVar34 = uVar34 ^ *(ulong *)(pBVar9 + lVar16);
      uVar40 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar34 = (uVar40 >> 3 & 0x1fffffff) + lVar32;
    }
    else {
      uVar40 = *puVar48 ^ *puVar23;
      uVar34 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar34 = uVar34 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_007eddd5:
    if ((puVar51 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar23 == (int)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 4);
      puVar23 = (ulong *)((long)puVar23 + 4);
    }
    if ((puVar51 < (ulong *)((long)iEnd + -1)) && ((short)*puVar23 == (short)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 2);
      puVar23 = (ulong *)((long)puVar23 + 2);
    }
    if (puVar51 < iEnd) {
      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar51));
    }
    uVar34 = (long)puVar51 - (long)puVar48;
  }
  uVar34 = uVar34 + 4;
  if (puVar52 < puVar25) {
    pBVar19 = pBVar9 + (uVar22 - 1);
    do {
      puVar48 = (ulong *)((long)puVar24 + -1);
      if ((*(BYTE *)puVar48 != *pBVar19) ||
         (uVar34 = uVar34 + 1, puVar24 = puVar48, puVar48 <= puVar52)) break;
      bVar13 = iStart < pBVar19;
      pBVar19 = pBVar19 + -1;
    } while (bVar13);
  }
  uVar43 = (int)puVar25 - (int)piVar31;
  if (uVar43 == 0) goto LAB_007ee538;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_007ee3a5;
  if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
  uVar22 = (long)puVar24 - (long)puVar52;
  puVar48 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar48 + uVar22)) goto LAB_007ee421;
  if (iEnd < puVar24) goto LAB_007ee402;
  if (puVar1 < puVar24) {
    ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar24,(BYTE *)puVar1);
LAB_007edee8:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar48 = *puVar52;
    puVar48[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_007ee576;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_007edee8;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_007ee3e3;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_007ee161;
  ZVar7 = seqStore->longLengthType;
joined_r0x007ee142:
  local_130 = uVar37;
  if (ZVar7 != ZSTD_llt_none) goto LAB_007ee440;
LAB_007ee148:
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
LAB_007ee161:
  puVar52 = (ulong *)(uVar34 + (long)puVar24);
  psVar45->mlBase = (U16)uVar22;
  psVar45 = psVar45 + 1;
  seqStore->sequences = psVar45;
  uVar37 = uVar43;
  if (puVar52 <= puVar29) {
    if (pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_007ee519;
    pUVar12[(uint)(*(int *)(pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2) * -0x61c8864f
                  ) >> (bVar21 & 0x1f)] = UVar46 + 2;
    pUVar12[(uint)(*(int *)((long)puVar52 + -2) * -0x61c8864f) >> (bVar21 & 0x1f)] =
         ((int)puVar52 + -2) - iVar41;
    do {
      uVar42 = uVar43;
      UVar46 = (int)puVar52 - iVar41;
      uVar43 = UVar46 - local_130;
      pBVar19 = pBVar9;
      if (uVar43 < uVar4) {
        pBVar19 = pBVar10 + -(ulong)uVar26;
      }
      uVar37 = uVar42;
      if (((uVar4 - 1) - uVar43 < 3) || (*(int *)(pBVar19 + uVar43) != (int)*puVar52)) break;
      puVar48 = iEnd;
      if (uVar43 < uVar4) {
        puVar48 = mEnd;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar19 + uVar43) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar48,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar45 - (long)seqStore->sequencesStart >> 3))
      goto LAB_007ee3a5;
      if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
      puVar48 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar48) goto LAB_007ee421;
      if (iEnd < puVar52) goto LAB_007ee402;
      if (puVar1 < puVar52) {
        ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar1);
      }
      else {
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
      }
      psVar45 = seqStore->sequences;
      psVar45->litLength = 0;
      psVar45->offBase = 1;
      if (sVar18 + 4 < 3) goto LAB_007ee3e3;
      if (0xffff < sVar18 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee440;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar45->mlBase = (U16)(sVar18 + 1);
      psVar45 = psVar45 + 1;
      seqStore->sequences = psVar45;
      pUVar12[(uint)((int)*puVar52 * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar46;
      puVar52 = (ulong *)((long)puVar52 + sVar18 + 4);
      uVar37 = local_130;
      uVar43 = local_130;
      local_130 = uVar42;
    } while (puVar52 <= puVar29);
  }
  puVar48 = (ulong *)((long)puVar52 + uVar47);
  puVar25 = puVar52;
  if (puVar29 < puVar48) goto LAB_007ee381;
  goto LAB_007ed9e5;
  while (bVar13 = pBVar50 < pBVar19, pBVar19 = pBVar19 + -1, bVar13) {
LAB_007ebc08:
    puVar23 = (ulong *)((long)puVar48 + -1);
    if ((*(BYTE *)puVar23 != *pBVar19) ||
       (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
  }
LAB_007ebec1:
  uVar43 = UVar46 - (uVar42 + uVar26);
  if (uVar43 == 0) {
LAB_007ee595:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x23b,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_007ee3a5;
  if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_007ee421;
  if (iEnd < puVar48) goto LAB_007ee402;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_007ebf40:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_007ee576;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_007ebf40;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_007ee3e3;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_007ec050;
  ZVar7 = seqStore->longLengthType;
  goto joined_r0x007ec031;
LAB_007ebac3:
  puVar23 = (ulong *)((long)puVar25 + 4);
  puVar24 = (ulong *)(piVar31 + 1);
  puVar51 = puVar23;
  if (puVar23 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar24 == *puVar23) {
      lVar32 = 0;
      do {
        puVar24 = (ulong *)((long)puVar25 + lVar32 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar24) {
          puVar24 = (ulong *)(pBVar9 + lVar32 + uVar17 + 0xc);
          puVar51 = (ulong *)((long)puVar25 + lVar32 + 0xc);
          goto LAB_007ebca7;
        }
        lVar16 = lVar32 + uVar17 + 0xc;
        uVar34 = *puVar24;
        lVar32 = lVar32 + 8;
      } while (*(ulong *)(pBVar9 + lVar16) == uVar34);
      uVar34 = uVar34 ^ *(ulong *)(pBVar9 + lVar16);
      uVar22 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar34 = (uVar22 >> 3 & 0x1fffffff) + lVar32;
    }
    else {
      uVar22 = *puVar23 ^ *puVar24;
      uVar34 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar34 = uVar34 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_007ebca7:
    if ((puVar51 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 4);
      puVar24 = (ulong *)((long)puVar24 + 4);
    }
    if ((puVar51 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 2);
      puVar24 = (ulong *)((long)puVar24 + 2);
    }
    if (puVar51 < iEnd) {
      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar51));
    }
    uVar34 = (long)puVar51 - (long)puVar23;
  }
  uVar34 = uVar34 + 4;
  if (puVar52 < puVar25) {
    pBVar19 = pBVar9 + (uVar17 - 1);
    do {
      puVar23 = (ulong *)((long)puVar48 + -1);
      if ((*(BYTE *)puVar23 != *pBVar19) ||
         (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
      bVar13 = iStart < pBVar19;
      pBVar19 = pBVar19 + -1;
    } while (bVar13);
  }
  uVar43 = (int)puVar25 - (int)piVar31;
  if (uVar43 == 0) {
LAB_007ee538:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x24d,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_007ee3a5:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_007ee3c4:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) {
LAB_007ee421:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a0,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (iEnd < puVar48) {
LAB_007ee402:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a1,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_007ebdc0:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee557;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2)))) {
LAB_007ee576:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                      ,0xe9,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_007ebdc0;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_007ee3e3;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_007ec050;
  ZVar7 = seqStore->longLengthType;
joined_r0x007ec031:
  local_130 = uVar37;
  if (ZVar7 != ZSTD_llt_none) goto LAB_007ee440;
LAB_007ec037:
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
LAB_007ec050:
  puVar52 = (ulong *)(uVar34 + (long)puVar48);
  psVar45->mlBase = (U16)uVar22;
  psVar45 = psVar45 + 1;
  seqStore->sequences = psVar45;
  uVar37 = uVar43;
  if (puVar52 <= puVar29) {
    if (pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2 <= src) {
LAB_007ee519:
      __assert_fail("base+curr+2 > istart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x269,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    pUVar12[(ulong)(*(long *)(pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2) *
                   -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar46 + 2;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] =
         ((int)puVar52 + -2) - iVar41;
    do {
      uVar42 = uVar43;
      UVar46 = (int)puVar52 - iVar41;
      uVar43 = UVar46 - local_130;
      pBVar19 = pBVar9;
      if (uVar43 < uVar4) {
        pBVar19 = pBVar10 + -(ulong)uVar26;
      }
      uVar37 = uVar42;
      if (((uVar4 - 1) - uVar43 < 3) || (*(int *)(pBVar19 + uVar43) != (int)*puVar52)) break;
      puVar48 = iEnd;
      if (uVar43 < uVar4) {
        puVar48 = mEnd;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar19 + uVar43) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar48,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar45 - (long)seqStore->sequencesStart >> 3))
      goto LAB_007ee3a5;
      if (0x20000 < seqStore->maxNbLit) goto LAB_007ee3c4;
      puVar48 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar48) goto LAB_007ee421;
      if (iEnd < puVar52) goto LAB_007ee402;
      if (puVar1 < puVar52) {
        ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar1);
      }
      else {
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
      }
      psVar45 = seqStore->sequences;
      psVar45->litLength = 0;
      psVar45->offBase = 1;
      if (sVar18 + 4 < 3) goto LAB_007ee3e3;
      if (0xffff < sVar18 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007ee440;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar45->mlBase = (U16)(sVar18 + 1);
      psVar45 = psVar45 + 1;
      seqStore->sequences = psVar45;
      pUVar12[*puVar52 * -0x30e44323405a9d00 >> (bVar21 & 0x3f)] = UVar46;
      puVar52 = (ulong *)((long)puVar52 + sVar18 + 4);
      uVar43 = local_130;
      uVar37 = local_130;
      local_130 = uVar42;
    } while (puVar52 <= puVar29);
  }
  puVar48 = (ulong *)((long)puVar52 + uVar47);
  puVar25 = puVar52;
  if (puVar29 < puVar48) goto LAB_007ee381;
  goto LAB_007eb8a5;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}